

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBufferMap<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferMap<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  GLboolean GVar1;
  size_type sVar2;
  reference data;
  long lVar3;
  DILogger local_19d0;
  DILogger local_1850;
  DILogger local_16d0;
  DILogger local_1550;
  DILogger local_13d0;
  DILogger local_1250;
  DILogger local_10d0;
  DILogger local_f50;
  DILogger local_dd0;
  DILogger local_c50;
  DILogger local_ad0;
  DILogger local_950;
  DILogger local_7d0;
  DILogger local_650;
  DILogger local_4d0;
  void *local_350;
  void *buf;
  uint local_1c8;
  uint local_1c4;
  int dataHeight;
  int dataWidth;
  CDataArray dataRef;
  undefined1 local_198 [8];
  DIResult result;
  CBufferMap<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  result.status_ = (long)this;
  DIResult::DIResult((DIResult *)local_198);
  test_api::GL::GL_Only();
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,(int *)&local_1c4,(int *)&local_1c8);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,local_1c4,local_1c8,
             0x1e,0x32);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,data,0x88e8);
  lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result((DILogger *)&buf,(DIResult *)local_198,lVar3);
  DILogger::~DILogger((DILogger *)&buf);
  local_350 = glu::CallLogWrapper::glMapBuffer
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,35000);
  if (local_350 == (void *)0x0) {
    DIResult::error(&local_4d0,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_4d0,
               (char (*) [65])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY) returned NULL");
    DILogger::~DILogger(&local_4d0);
  }
  if (local_350 != (void *)0x0) {
    lVar3 = DrawIndirectBase::BufferCheck
                      (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,local_1c4,local_1c8,
                       local_350,local_1c4,local_1c8,0,0);
    DIResult::sub_result(&local_650,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_650);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',35000,1,0,sVar2 << 2);
    DIResult::sub_result(&local_7d0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_7d0);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_950,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_950,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_950);
    }
    local_350 = (void *)0x0;
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_ad0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_ad0);
  }
  local_350 = glu::CallLogWrapper::glMapBuffer
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,0x88b9);
  if (local_350 == (void *)0x0) {
    DIResult::error(&local_c50,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_c50,
               (char (*) [66])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY) returned NULL");
    DILogger::~DILogger(&local_c50);
  }
  if (local_350 != (void *)0x0) {
    lVar3 = DrawIndirectBase::BufferCheck
                      (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,local_1c4,local_1c8,
                       local_350,local_1c4,local_1c8,0,0);
    DIResult::sub_result(&local_dd0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_dd0);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,0,sVar2 << 2);
    DIResult::sub_result(&local_f50,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_f50);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 != '\x01') {
      DIResult::error(&local_10d0,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_10d0,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_10d0);
    }
    local_350 = (void *)0x0;
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_1250,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_1250);
  }
  local_350 = glu::CallLogWrapper::glMapBuffer
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,0x88ba);
  if (local_350 == (void *)0x0) {
    DIResult::error(&local_13d0,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_13d0,
               (char (*) [66])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE) returned NULL");
    DILogger::~DILogger(&local_13d0);
  }
  if (local_350 != (void *)0x0) {
    lVar3 = DrawIndirectBase::BufferCheck
                      (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,local_1c4,local_1c8,
                       local_350,local_1c4,local_1c8,0,0);
    DIResult::sub_result(&local_1550,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_1550);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88ba,3,0,sVar2 << 2);
    DIResult::sub_result(&local_16d0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_16d0);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_1850,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1850,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_1850);
    }
    local_350 = (void *)0x0;
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_19d0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_19d0);
  }
  lVar3 = DIResult::code((DIResult *)local_198);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DIResult::~DIResult((DIResult *)local_198);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		api::GL_Only();

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_ONLY, GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) != GL_TRUE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_WRITE, GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		return result.code();
	}